

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

void __thiscall QDockWidget::closeEvent(QDockWidget *this,QCloseEvent *event)

{
  QDockWidgetPrivate *this_00;
  bool bVar1;
  uint uVar2;
  undefined1 auVar4 [16];
  ulong uVar3;
  
  this_00 = *(QDockWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->state != (DragState *)0x0) {
    QDockWidgetPrivate::endDrag(this_00,Abort);
  }
  auVar4 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
  uVar3 = auVar4._8_8_;
  bVar1 = true;
  if ((auVar4._0_8_ != 0) &&
     (uVar2 = (this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
              super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 1, uVar3 = (ulong)uVar2,
     uVar2 == 0)) {
    bVar1 = (*(byte *)(*(long *)(auVar4._0_8_ + 0x20) + 9) & 0x80) == 0;
  }
  (**(code **)(*(long *)event + 0x10))(event,bVar1,uVar3,bVar1);
  return;
}

Assistant:

void QDockWidget::closeEvent(QCloseEvent *event)
{
    Q_D(QDockWidget);
    if (d->state)
        d->endDrag(QDockWidgetPrivate::EndDragMode::Abort);

    // For non-closable widgets, don't allow closing, except when the mainwindow
    // is hidden, as otherwise an application wouldn't be able to be shut down.
    const QMainWindow *win = qobject_cast<QMainWindow*>(parentWidget());
    const bool canClose = (d->features & DockWidgetClosable)
                       || (!win || !win->isVisible());
    event->setAccepted(canClose);
}